

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

string * __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_multiline_string_abi_cxx11_
          (string *__return_storage_ptr__,parser_t<comments_skipper_t> *this)

{
  size_t sVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint32_t codepoint;
  long lVar5;
  undefined8 *puVar6;
  char cVar7;
  size_t escape_sequence_offset;
  uint *local_78;
  undefined8 local_70;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar2 = input_stream_t::peek(&this->input);
  if ((cVar2 == '\r') || (cVar2 = input_stream_t::peek(&this->input), cVar2 == '\n')) {
    parse_new_line(this);
  }
LAB_00161b34:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          cVar2 = input_stream_t::peek(&this->input);
          cVar7 = (char)__return_storage_ptr__;
          if ((cVar2 != '\r') && (cVar2 = input_stream_t::peek(&this->input), cVar2 != '\n')) break;
          parse_new_line(this);
          std::__cxx11::string::push_back(cVar7);
        }
        bVar3 = input_stream_t::get(&this->input);
        if (bVar3 < 0x20) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
          local_58 = &local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"Control characters must be escaped","");
          sVar1 = (this->input).m_processed;
          lVar5 = 0;
          if (sVar1 != 0) {
            lVar5 = sVar1 - 1;
          }
          *puVar6 = &PTR__parser_error_t_001af398;
          puVar6[1] = puVar6 + 3;
          if (local_58 == &local_48) {
            *(uint *)(puVar6 + 3) = local_48;
            *(undefined4 *)((long)puVar6 + 0x1c) = uStack_44;
            *(undefined4 *)(puVar6 + 4) = uStack_40;
            *(undefined4 *)((long)puVar6 + 0x24) = uStack_3c;
          }
          else {
            puVar6[1] = local_58;
            puVar6[3] = CONCAT44(uStack_44,local_48);
          }
          puVar6[2] = local_50;
          local_50 = 0;
          local_48 = local_48 & 0xffffff00;
          puVar6[5] = lVar5;
          local_58 = &local_48;
          __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
        }
        if (bVar3 == 0x5c) break;
        if ((bVar3 == 0x22) && (cVar2 = input_stream_t::peek(&this->input), cVar2 == '\"')) {
          input_stream_t::get(&this->input);
          cVar2 = input_stream_t::peek(&this->input);
          if (cVar2 == '\"') {
            input_stream_t::get(&this->input);
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back(cVar7);
        }
        std::__cxx11::string::push_back(cVar7);
      }
      cVar2 = input_stream_t::peek(&this->input);
      if ((cVar2 != '\r') && (cVar2 = input_stream_t::peek(&this->input), cVar2 != '\n')) break;
      parse_new_line(this);
      while( true ) {
        cVar2 = input_stream_t::peek(&this->input);
        iVar4 = isspace((int)cVar2);
        if (iVar4 == 0) break;
        input_stream_t::get(&this->input);
      }
    }
    sVar1 = (this->input).m_processed;
    escape_sequence_offset = sVar1 - 1;
    if (sVar1 == 0) {
      escape_sequence_offset = 0;
    }
    bVar3 = input_stream_t::get(&this->input);
    if (bVar3 < 0x62) {
      if (bVar3 != 0x22) {
        if (bVar3 == 0x55) {
          codepoint = parse_8_digit_codepoint(this);
          goto LAB_00161c75;
        }
        if (bVar3 != 0x5c) goto switchD_00161c4b_caseD_6f;
      }
    }
    else {
      switch(bVar3) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_00161c4b_caseD_6f:
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Invalid escape-sequence","");
        *puVar6 = &PTR__parser_error_t_001af398;
        puVar6[1] = puVar6 + 3;
        if (local_78 == &local_68) {
          *(uint *)(puVar6 + 3) = local_68;
          *(undefined4 *)((long)puVar6 + 0x1c) = uStack_64;
          *(undefined4 *)(puVar6 + 4) = uStack_60;
          *(undefined4 *)((long)puVar6 + 0x24) = uStack_5c;
        }
        else {
          puVar6[1] = local_78;
          puVar6[3] = CONCAT44(uStack_64,local_68);
        }
        puVar6[2] = local_70;
        local_70 = 0;
        local_68 = local_68 & 0xffffff00;
        puVar6[5] = escape_sequence_offset;
        local_78 = &local_68;
        __cxa_throw(puVar6,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        codepoint = parse_4_digit_codepoint(this);
LAB_00161c75:
        process_codepoint(this,codepoint,escape_sequence_offset,__return_storage_ptr__);
        goto LAB_00161b34;
      default:
        if ((bVar3 != 0x66) && (bVar3 != 0x62)) goto switchD_00161c4b_caseD_6f;
      }
    }
    std::__cxx11::string::push_back(cVar7);
  } while( true );
}

Assistant:

std::string parse_multiline_string() {
        std::string result;

        // Ignore first new-line after open quotes.
        if (input.peek() == '\r' || input.peek() == '\n') {
            parse_new_line();
        }

        while (true) {
            if (input.peek() == '\r' || input.peek() == '\n') {
                parse_new_line();
                result.push_back('\n');
                continue;
            }

            char ch = input.get();
            if (iscontrol(ch)) {
                throw parser_error_t("Control characters must be escaped", last_char_offset());
            } else if (ch == '"') {
                if (input.peek() == '"') {
                    input.get();
                    if (input.peek() == '"') {
                        input.get();
                        break;
                    }
                    result.push_back('"');
                }
                result.push_back('"');
            } else if (ch == '\\') {
                if (input.peek() == '\r' || input.peek() == '\n') {
                    parse_new_line();
                    while (std::isspace(input.peek())) {
                        input.get();
                    }
                    continue;
                }

                std::size_t escape_sequence_offset = last_char_offset();
                char ch = input.get();
                if (ch == 'b') {
                    result.push_back('\b');
                } else if (ch == 't') {
                    result.push_back('\t');
                } else if (ch == 'n') {
                    result.push_back('\n');
                } else if (ch == 'f') {
                    result.push_back('\f');
                } else if (ch == 'r') {
                    result.push_back('\r');
                } else if (ch == '"') {
                    result.push_back('"');
                } else if (ch == '\\') {
                    result.push_back('\\');
                } else if (ch == 'u') {
                    process_codepoint(parse_4_digit_codepoint(), escape_sequence_offset, result);
                } else if (ch == 'U') {
                    process_codepoint(parse_8_digit_codepoint(), escape_sequence_offset, result);
                } else {
                    throw parser_error_t("Invalid escape-sequence", escape_sequence_offset);
                }
            } else {
                result.push_back(ch);
            }
        }

        return result;
    }